

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qversionnumber.cpp
# Opt level: O0

QString * __thiscall QVersionNumber::toString(QVersionNumber *this)

{
  bool bVar1;
  qsizetype qVar2;
  Promoted<long_long,_int> asize;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype i;
  bool first;
  QString *version;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  QString *in_stack_ffffffffffffff70;
  long index;
  QString *this_00;
  long local_60;
  QChar local_16;
  int local_14;
  long local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QString::QString((QString *)0x637e9f);
  qVar2 = segmentCount((QVersionNumber *)0x637ea9);
  local_10 = qVar2 * 2 + -1;
  local_14 = 0;
  asize = qMax<long_long,int>(&local_10,&local_14);
  QString::reserve(this_00,asize);
  bVar1 = true;
  local_60 = 0;
  while (index = local_60, qVar2 = segmentCount((QVersionNumber *)0x637f10), index < qVar2) {
    if (!bVar1) {
      QChar::QChar<char16_t,_true>(&local_16,L'.');
      QString::operator+=(in_stack_ffffffffffffff70,(QChar)(char16_t)((ulong)index >> 0x30));
    }
    segmentAt((QVersionNumber *)this_00,index);
    QString::number(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    QString::operator+=(in_stack_ffffffffffffff70,
                        (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    QString::~QString((QString *)0x637fa4);
    bVar1 = false;
    local_60 = local_60 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QString QVersionNumber::toString() const
{
    QString version;
    version.reserve(qMax(segmentCount() * 2 - 1, 0));
    bool first = true;
    for (qsizetype i = 0; i < segmentCount(); ++i) {
        if (!first)
            version += u'.';
        version += QString::number(segmentAt(i));
        first = false;
    }
    return version;
}